

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void __thiscall polyscope::Histogram::Histogram(Histogram *this)

{
  pair<double,_double> *in_RDI;
  nullptr_t in_stack_ffffffffffffff98;
  pair<double,_double> *this_00;
  allocator local_15 [21];
  
  std::pair<double,_double>::pair<double,_double,_true>(in_RDI);
  in_RDI[1].first = 2.51973479379036e-322;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x53b263);
  std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
            ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)0x53b276);
  std::pair<double,_double>::pair<double,_double,_true>((pair<double,_double> *)&in_RDI[4].second);
  *(undefined4 *)&in_RDI[5].second = 600;
  this_00 = in_RDI + 6;
  std::shared_ptr<polyscope::render::TextureBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)this_00,in_stack_ffffffffffffff98);
  std::shared_ptr<polyscope::render::FrameBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::FrameBuffer> *)this_00,in_stack_ffffffffffffff98);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)this_00,in_stack_ffffffffffffff98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 9),"viridis",local_15);
  std::allocator<char>::~allocator((allocator<char> *)local_15);
  *(undefined4 *)&in_RDI[0xb].first = 0x3eb33333;
  *(undefined4 *)((long)&in_RDI[0xb].first + 4) = 0x3dcccccd;
  return;
}

Assistant:

Histogram::Histogram() {}